

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mocks.h
# Opt level: O1

bool __thiscall
agge::tests::mocks::renderer_adapter<unsigned_short>::render_log_entry::operator==
          (render_log_entry *this,render_log_entry *rhs)

{
  pointer __s1;
  pointer puVar1;
  pointer __s2;
  int iVar2;
  size_t __n;
  
  if (this->x == rhs->x) {
    __s1 = (this->covers).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
           _M_impl.super__Vector_impl_data._M_start;
    puVar1 = (this->covers).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    __n = (long)puVar1 - (long)__s1;
    __s2 = (rhs->covers).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
           .super__Vector_impl_data._M_start;
    if (__n == (long)(rhs->covers).
                     super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)__s2) {
      if (puVar1 != __s1) {
        iVar2 = bcmp(__s1,__s2,__n);
        return iVar2 == 0;
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool operator ==(const render_log_entry &rhs) const
					{	return x == rhs.x && covers == rhs.covers;	}